

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  ushort uVar1;
  _Bool _Var2;
  DecodeStatus DVar3;
  uint uVar4;
  uint uVar5;
  DecodeStatus extraout_EAX;
  MCOperand *pMVar6;
  ulong uVar7;
  MCOperandInfo *m;
  ulong Val;
  
  DVar3 = MCInst_getOpcode(MI);
  if ((((DVar3 - 0xa98 < 0x35) && ((0x1000100000010dU >> ((ulong)(DVar3 - 0xa98) & 0x3f) & 1) != 0))
      || ((DVar3 = DVar3 - 0x904, DVar3 < 0xe && ((0x3801U >> (DVar3 & 0x1f) & 1) != 0)))) &&
     ((ud->ITBlock).size == 0)) {
    return DVar3;
  }
  uVar4 = (ud->ITBlock).size;
  uVar5 = 0xe;
  if (uVar4 != 0) {
    uVar5 = (uint)(ud->ITBlock).ITStates[uVar4 - 1];
  }
  Val = 0xe;
  if (uVar5 != 0xf) {
    Val = (ulong)uVar5;
  }
  if (uVar4 != 0) {
    (ud->ITBlock).size = uVar4 - 1;
  }
  uVar4 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(MI);
  uVar1 = ARMInsts[uVar4].NumOperands;
  uVar4 = (uint)uVar1;
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar5 = MCInst_getNumOperands(MI);
      if ((uVar7 == uVar5) || (_Var2 = MCOperandInfo_isPredicate(m), _Var2)) {
        uVar4 = (uint)uVar7;
        break;
      }
      uVar7 = uVar7 + 1;
      m = m + 1;
    } while (uVar1 != uVar7);
  }
  pMVar6 = MCOperand_CreateImm1(MI,Val);
  MCInst_insert0(MI,uVar4,pMVar6);
  pMVar6 = MCOperand_CreateReg1(MI,(uint)((int)Val != 0xe) * 3);
  MCInst_insert0(MI,uVar4 + 1,pMVar6);
  return extraout_EAX;
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}